

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O2

bool __thiscall
QTranslator::load(QTranslator *this,QString *filename,QString *directory,QString *search_delimiters,
                 QString *suffix)

{
  QTranslatorPrivate *this_00;
  char16_t *pcVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  qsizetype qVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&> local_108;
  QFileInfo fi;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QStringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTranslatorPrivate *)(this->super_QObject).d_ptr.d;
  QTranslatorPrivate::clear(this_00);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QFileInfo::QFileInfo((QFileInfo *)&local_78,filename);
  bVar4 = QFileInfo::isRelative((QFileInfo *)&local_78);
  QFileInfo::~QFileInfo((QFileInfo *)&local_78);
  if (bVar4) {
    QString::operator=((QString *)&local_58,directory);
    if (local_58.size != 0) {
      bVar4 = QString::endsWith((QString *)&local_58,(QChar)0x2f,CaseSensitive);
      if (!bVar4) {
        QString::append((QString *)&local_58,(QChar)0x2f);
      }
    }
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar1 = (suffix->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    dotQmLiteral();
  }
  else {
    local_78.d = (suffix->d).d;
    local_78.size = (suffix->d).size;
    local_78.ptr = pcVar1;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  local_88.m_data = (filename->d).ptr;
  local_88.m_size = (filename->d).size;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char16_t *)0x0;
  local_a8.size = 0;
  local_c8.ptr = (search_delimiters->d).ptr;
  if (local_c8.ptr == (char16_t *)0x0) {
    local_c8.d = (Data *)0x0;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_c8.ptr = L"_.";
    local_e8.size = 0;
    local_c8.size = 2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  }
  else {
    local_c8.d = (search_delimiters->d).d;
    local_c8.size = (search_delimiters->d).size;
    if (local_c8.d != (Data *)0x0) {
      LOCK();
      ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  do {
    fi.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&fi);
    local_108.b = (QString *)&local_78;
    local_108.a.a = (QString *)&local_58;
    local_108.a.b = &local_88;
    QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_e8,&local_108);
    qVar5 = local_a8.size;
    pcVar1 = local_a8.ptr;
    pDVar3 = local_a8.d;
    local_a8.d = local_e8.d;
    local_a8.ptr = local_e8.ptr;
    local_e8.d = pDVar3;
    local_e8.ptr = pcVar1;
    local_a8.size = local_e8.size;
    local_e8.size = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QFileInfo::setFile(&fi,(QString *)&local_a8);
    bVar4 = QFileInfo::isReadable(&fi);
    if (bVar4) {
      bVar4 = QFileInfo::isFile(&fi);
      if (!bVar4) goto LAB_002a0aae;
LAB_002a0b84:
      QFileInfo::~QFileInfo(&fi);
      bVar4 = QTranslatorPrivate::do_load(this_00,(QString *)&local_a8,directory);
      goto LAB_002a0bb1;
    }
LAB_002a0aae:
    local_108.a.a = (QString *)&local_58;
    local_108.a.b = &local_88;
    QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>((QString *)&local_e8,&local_108.a);
    qVar5 = local_a8.size;
    pcVar1 = local_a8.ptr;
    pDVar3 = local_a8.d;
    local_a8.d = local_e8.d;
    local_a8.ptr = local_e8.ptr;
    local_e8.d = pDVar3;
    local_e8.ptr = pcVar1;
    local_a8.size = local_e8.size;
    local_e8.size = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QFileInfo::setFile(&fi,(QString *)&local_a8);
    bVar4 = QFileInfo::isReadable(&fi);
    if (bVar4) {
      bVar4 = QFileInfo::isFile(&fi);
      if (bVar4) goto LAB_002a0b84;
    }
    pcVar1 = local_c8.ptr;
    lVar2 = local_c8.size * 2;
    lVar7 = 0;
    for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 2) {
      qVar5 = QStringView::lastIndexOf
                        (&local_88,(QChar)*(char16_t *)((long)pcVar1 + lVar6),CaseSensitive);
      if (lVar7 <= qVar5) {
        lVar7 = qVar5;
      }
    }
    if (lVar7 == 0) {
      QFileInfo::~QFileInfo(&fi);
      bVar4 = false;
LAB_002a0bb1:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar4;
      }
      __stack_chk_fail();
    }
    local_88.m_size = lVar7;
    QFileInfo::~QFileInfo(&fi);
  } while( true );
}

Assistant:

bool QTranslator::load(const QString & filename, const QString & directory,
                       const QString & search_delimiters,
                       const QString & suffix)
{
    Q_D(QTranslator);
    d->clear();

    QString prefix;
    if (QFileInfo(filename).isRelative()) {
        prefix = directory;
        if (prefix.size() && !prefix.endsWith(u'/'))
            prefix += u'/';
    }

    const QString suffixOrDotQM = suffix.isNull() ? dotQmLiteral() : suffix;
    QStringView fname(filename);
    QString realname;
    const QString delims = search_delimiters.isNull() ? QStringLiteral("_.") : search_delimiters;

    for (;;) {
        QFileInfo fi;

        realname = prefix + fname + suffixOrDotQM;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        realname = prefix + fname;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        qsizetype rightmost = 0;
        for (auto ch : delims)
            rightmost = std::max(rightmost, fname.lastIndexOf(ch));

        // no truncations? fail
        if (rightmost == 0)
            return false;

        fname.truncate(rightmost);
    }

    // realname is now the fully qualified name of a readable file.
    return d->do_load(realname, directory);
}